

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMLSParserImpl::loadGrammar(DOMLSParserImpl *this)

{
  byte in_CL;
  GrammarType in_EDX;
  DOMLSInput *in_RSI;
  
  loadGrammar((DOMLSParserImpl *)&this[-1].super_AbstractDOMParser.fDocumentVector,in_RSI,in_EDX,
              (bool)(in_CL & 1));
  return;
}

Assistant:

Grammar* DOMLSParserImpl::loadGrammar(const DOMLSInput* source,
                                     const Grammar::GrammarType grammarType,
                                     const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &DOMLSParserImpl::resetParse);

    Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        Wrapper4DOMLSInput isWrapper((DOMLSInput*)source, fEntityResolver, false, getMemoryManager());
        grammar = getScanner()->loadGrammar(isWrapper, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}